

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_column_writer.cpp
# Opt level: O2

void __thiscall
duckdb::PrimitiveColumnWriter::RegisterToRowGroup(PrimitiveColumnWriter *this,RowGroup *row_group)

{
  ColumnChunk column_chunk;
  undefined1 auStack_298 [112];
  type local_228;
  int64_t local_220;
  _ColumnChunk__isset local_20;
  
  duckdb_parquet::ColumnChunk::ColumnChunk((ColumnChunk *)auStack_298);
  local_20 = (_ColumnChunk__isset)((byte)local_20 | 2);
  local_228 = ((this->super_ColumnWriter).writer)->codec;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(auStack_298 + 0x58),
              &(this->super_ColumnWriter).schema_path.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
  local_220 = 0;
  auStack_298._56_4_ =
       ParquetWriter::GetType
                 ((this->super_ColumnWriter).writer,
                  ((this->super_ColumnWriter).column_schema)->schema_index);
  ::std::vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>::
  emplace_back<duckdb_parquet::ColumnChunk>
            (&(row_group->columns).
              super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
             ,(ColumnChunk *)auStack_298);
  duckdb_parquet::ColumnChunk::~ColumnChunk((ColumnChunk *)auStack_298);
  return;
}

Assistant:

void PrimitiveColumnWriter::RegisterToRowGroup(duckdb_parquet::RowGroup &row_group) {
	duckdb_parquet::ColumnChunk column_chunk;
	column_chunk.__isset.meta_data = true;
	column_chunk.meta_data.codec = writer.GetCodec();
	column_chunk.meta_data.path_in_schema = schema_path;
	column_chunk.meta_data.num_values = 0;
	column_chunk.meta_data.type = writer.GetType(SchemaIndex());
	row_group.columns.push_back(std::move(column_chunk));
}